

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O1

Node * __thiscall
Lexical::identifierProgram
          (Node *__return_storage_ptr__,Lexical *this,int *nowProcedure,int *checkTable,
          int *checkKind)

{
  pointer *ppiVar1;
  int iVar2;
  ulong uVar3;
  pointer pWVar4;
  int beginIndex;
  int local_34;
  int local_30 [2];
  
  Generator::pushIndex(&this->generator);
  local_34 = this->wordIndex;
  uVar3 = (long)local_34 + 1;
  this->wordIndex = (int)uVar3;
  pWVar4 = (this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pWVar4[uVar3].symbol == (this->parsing).identifierBase) {
    pWVar4 = pWVar4 + uVar3;
    if (*checkTable != 2) {
      if (*checkTable == 1) {
        if (*checkKind == 1) {
          local_30[0] = 0;
          iVar2 = findDescription(this,&pWVar4->token,nowProcedure,local_30);
          if (iVar2 == -1) {
            local_30[1] = 1;
            iVar2 = findDescription(this,&(this->words).
                                          super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                                          super__Vector_impl_data._M_start[this->wordIndex].token,
                                    nowProcedure,local_30 + 1);
            if (iVar2 == -1) {
              uVar3 = (ulong)(uint)this->wordIndex;
              iVar2 = 0x1f;
              goto LAB_00109c9e;
            }
          }
        }
        else {
          local_30[0] = 2;
          iVar2 = findDescription(this,&pWVar4->token,nowProcedure,local_30);
          if (iVar2 == -1) {
            uVar3 = (ulong)(uint)this->wordIndex;
            iVar2 = 0x20;
            goto LAB_00109c9e;
          }
        }
      }
LAB_00109cc0:
      ppiVar1 = &(this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppiVar1 = *ppiVar1 + -1;
      pWVar4 = (this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_30[0] = this->nodeCnt;
      this->nodeCnt = local_30[0] + 1;
      Node::Node(__return_storage_ptr__,&pWVar4[this->wordIndex].token,local_30,&this->wordIndex,
                 &this->wordIndex);
      return __return_storage_ptr__;
    }
    local_30[0] = 0;
    iVar2 = Procedure::findDes((this->procedureTable).
                               super__Vector_base<Procedure,_std::allocator<Procedure>_>._M_impl.
                               super__Vector_impl_data._M_start + *nowProcedure,&pWVar4->token,
                               local_30);
    uVar3 = (ulong)this->wordIndex;
    if (iVar2 == -1) {
      local_30[0] = 1;
      iVar2 = Procedure::findDes((this->procedureTable).
                                 super__Vector_base<Procedure,_std::allocator<Procedure>_>._M_impl.
                                 super__Vector_impl_data._M_start + *nowProcedure,
                                 &(this->words).super__Vector_base<Word,_std::allocator<Word>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar3].token,local_30);
      uVar3 = (ulong)this->wordIndex;
      if (iVar2 == -1) {
        local_30[0] = 2;
        iVar2 = Procedure::findDes((this->procedureTable).
                                   super__Vector_base<Procedure,_std::allocator<Procedure>_>._M_impl
                                   .super__Vector_impl_data._M_start + *nowProcedure,
                                   &(this->words).super__Vector_base<Word,_std::allocator<Word>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar3].token,local_30);
        if (iVar2 == -1) goto LAB_00109cc0;
        uVar3 = (ulong)(uint)this->wordIndex;
      }
    }
    iVar2 = 0x21;
  }
  else {
    iVar2 = 0x19;
  }
LAB_00109c9e:
  errorParsing(__return_storage_ptr__,this,&local_34,(int)uVar3,iVar2);
  return __return_storage_ptr__;
}

Assistant:

Node identifierProgram(const int &nowProcedure, const int &checkTable=0, const int &checkKind=1) {
		generator.pushIndex();
		int beginIndex = wordIndex;

		if (words[++wordIndex].symbol == parsing.identifierBase) {
			if (checkTable == 1) {
				if (checkKind == 1) {
					if (findDescription(words[wordIndex].token, nowProcedure, 0) == -1 and
					    findDescription(words[wordIndex].token, nowProcedure, 1) == -1)
						return errorParsing(beginIndex, wordIndex, 31);
				} else {
					if (findDescription(words[wordIndex].token, nowProcedure, 2) == -1)
						return errorParsing(beginIndex, wordIndex, 32);
				}
			} else if (checkTable == 2) {
				if (checkDescription(words[wordIndex].token, nowProcedure, 0) != -1)
					return errorParsing(beginIndex, wordIndex, 33);
				if (checkDescription(words[wordIndex].token, nowProcedure, 1) != -1)
					return errorParsing(beginIndex, wordIndex, 33);
				if (checkDescription(words[wordIndex].token, nowProcedure, 2) != -1)
					return errorParsing(beginIndex, wordIndex, 33);
			}

			generator.popIndex();
			return Node(words[wordIndex].token, nodeCnt++, wordIndex, wordIndex);
		}
		return errorParsing(beginIndex, wordIndex, 25); // BASE ERROR
	}